

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_names_section(parser *p)

{
  uint uVar1;
  parser_error pVar2;
  uint *puVar3;
  
  uVar1 = parser_getuint(p,"section");
  puVar3 = (uint *)parser_priv(p);
  if (uVar1 < 3) {
    *puVar3 = uVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  else {
    pVar2 = PARSE_ERROR_OUT_OF_BOUNDS;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_names_section(struct parser *p) {
	unsigned int section = parser_getuint(p, "section");
	struct names_parse *s = parser_priv(p);

	if (section >= RANDNAME_NUM_TYPES) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	s->section = section;
	return PARSE_ERROR_NONE;
}